

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writebmp.cpp
# Opt level: O0

void writeBMP(char *filename,char *data,int W,int H)

{
  int in_ECX;
  int in_EDX;
  long in_RSI;
  char *in_RDI;
  int k;
  int x;
  int y;
  int size;
  char h [54];
  FILE *fout;
  int local_68;
  int local_64;
  int local_60;
  undefined1 local_58;
  undefined1 local_57;
  int local_56;
  undefined1 local_4e;
  undefined1 local_4a;
  int local_46;
  int local_42;
  undefined1 local_3e;
  undefined1 local_3c;
  undefined1 auStack_3a [26];
  FILE *local_20;
  int local_18;
  int local_14;
  long local_10;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_20 = fopen(in_RDI,"wb");
  memset(&local_58,0,0x36);
  local_58 = 0x42;
  local_57 = 0x4d;
  local_4e = 0x36;
  local_4a = 0x28;
  local_3e = 1;
  local_3c = 0x18;
  local_56 = ((local_14 * 3 + 3) / 4) * 4 * local_18 + 0x36;
  local_46 = local_14;
  local_42 = local_18;
  fwrite(&local_58,0x36,1,local_20);
  while (local_60 = local_18 + -1, local_60 != -1) {
    for (local_64 = 0; local_64 < local_14; local_64 = local_64 + 1) {
      for (local_68 = 2; local_68 != -1; local_68 = local_68 + -1) {
        fwrite((void *)(local_10 + local_60 * local_14 * 3 + (long)(local_64 * 3) + (long)local_68),
               1,1,local_20);
      }
    }
    fwrite(auStack_3a,1,(long)(local_14 % 4),local_20);
    local_18 = local_60;
  }
  fclose(local_20);
  return;
}

Assistant:

void writeBMP(const char* filename, char* data, int W, int H)
// data: RGB, top left -> bottom right, no padding
{
	FILE* fout = fopen(filename, "wb");
	char h[54] = "BM";
	h[10] = 54; // header size
	h[14] = 40; // info size
	h[26] = 1;
	h[28] = 24; // bit per pixel
	int size = 54 + (W*3+3)/4*4*H;
	memcpy(h+2, &size, 4);
	memcpy(h+18, &W, 4);
	memcpy(h+22, &H, 4);
	fwrite(h, 54, 1, fout);
	for (int y=H-1; ~y; --y) {
		for (int x=0; x<W; ++x)
			for (int k=2; ~k; --k) // RGB -> BGR
				fwrite(data+y*W*3+x*3+k, 1, 1, fout);
		// pad to 4n bytes per row
		fwrite(h+30, 1, W%4, fout);
	}
	fclose(fout);
}